

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsearch.h
# Opt level: O3

void SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
     ::_search_run_fn(search *sch)

{
  void *pvVar1;
  long *plVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  
  pvVar1 = sch->task_data;
  plVar2 = *(long **)((long)pvVar1 + 0x18);
  if (((plVar2 != (long *)0x0) && (*(long *)((long)pvVar1 + 0x48) != 0)) &&
     (*(long *)((long)pvVar1 + 0x50) != 0)) {
    (**(code **)(*plVar2 + 0x10))(plVar2,sch);
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,
                           "error: calling _search_run_fn without setting run object");
  std::endl<char,std::char_traits<char>>(poVar3);
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = exit;
  __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void _search_run_fn(Search::search&sch)
  { HookTask::task_data* d = sch.get_task_data<HookTask::task_data>();
    if ((d->run_object == NULL) || (d->extra_data == NULL) || (d->extra_data2 == NULL))
    { cerr << "error: calling _search_run_fn without setting run object" << endl;
      throw exception();
    }
    ((SearchTask*)d->run_object)->_run(sch, *(INPUT*)d->extra_data, *(OUTPUT*)d->extra_data2);
  }